

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void do_cmd_refill(command *cmd)

{
  loc grid;
  _Bool _Var1;
  short sVar2;
  wchar_t wVar3;
  object *poVar4;
  player_upkeep *ppVar5;
  uint32_t uVar6;
  char *fmt;
  _Bool local_31;
  object *used;
  object *obj;
  
  poVar4 = equipped_item_by_slot_name(player,"light");
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if (!_Var1) {
    return;
  }
  if ((poVar4 == (object *)0x0) || (_Var1 = tval_is_light(poVar4), !_Var1)) {
    fmt = "You are not wielding a light.";
  }
  else {
    _Var1 = flag_has_dbg(poVar4->flags,5,0x15,"light->flags","OF_NO_FUEL");
    if ((!_Var1) &&
       (_Var1 = flag_has_dbg(poVar4->flags,5,0x14,"light->flags","OF_TAKES_FUEL"), _Var1)) {
      wVar3 = cmd_get_item((command_conflict *)cmd,"item",&obj,"Refuel with with fuel source? ",
                           "You have nothing you can refuel with.",obj_can_refill,L'\x0e');
      if (wVar3 == L'\0') {
        sVar2 = obj->timeout;
        if (sVar2 == 0) {
          sVar2 = obj->pval;
        }
        poVar4->timeout = poVar4->timeout + sVar2;
        msg("You fuel your lamp.");
        if ((int)(uint)z_info->fuel_lamp <= (int)poVar4->timeout) {
          poVar4->timeout = z_info->fuel_lamp;
          msg("Your lamp is full.");
        }
        _Var1 = flag_has_dbg(obj->flags,5,0x14,"obj->flags","OF_TAKES_FUEL");
        if (_Var1) {
          if (obj->number < 2) {
            obj->timeout = 0;
          }
          else {
            poVar4 = object_split(obj,L'\x01');
            poVar4->timeout = 0;
            used = poVar4;
            _Var1 = object_is_carried(player,obj);
            if ((_Var1) && (_Var1 = inven_carry_okay(poVar4), _Var1)) {
              inven_carry(player,poVar4,true,true);
            }
            else {
              grid.x = (player->grid).x;
              grid.y = (player->grid).y;
              drop_near((chunk *)cave,&used,L'\0',grid,false,true);
            }
          }
          ppVar5 = player->upkeep;
          ppVar5->notice = ppVar5->notice | 1;
          uVar6 = ppVar5->redraw | 0x20000;
          ppVar5->redraw = uVar6;
        }
        else {
          local_31 = false;
          _Var1 = object_is_carried(player,obj);
          if (_Var1) {
            used = gear_object_for_use(player,obj,L'\x01',true,&local_31);
          }
          else {
            used = floor_object_for_use(player,obj,L'\x01',true,&local_31);
          }
          if (used->known != (object *)0x0) {
            object_delete((chunk *)player->cave,(chunk *)0x0,&used->known);
          }
          object_delete((chunk *)cave,(chunk *)player->cave,&used);
          ppVar5 = player->upkeep;
          uVar6 = ppVar5->redraw;
        }
        *(byte *)&ppVar5->update = (byte)ppVar5->update | 2;
        ppVar5->redraw = uVar6 | 0x40000;
        ppVar5->energy_use = (uint)(z_info->move_energy >> 1);
        return;
      }
      return;
    }
    fmt = "Your light cannot be refilled.";
  }
  msg(fmt);
  return;
}

Assistant:

void do_cmd_refill(struct command *cmd)
{
	struct object *light = equipped_item_by_slot_name(player, "light");
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Check what we're wielding. */
	if (!light || !tval_is_light(light)) {
		msg("You are not wielding a light.");
		return;
	} else if (of_has(light->flags, OF_NO_FUEL)
			|| !of_has(light->flags, OF_TAKES_FUEL)) {
		msg("Your light cannot be refilled.");
		return;
	}

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Refuel with with fuel source? ",
			"You have nothing you can refuel with.",
			obj_can_refill,
			USE_INVEN | USE_FLOOR | USE_QUIVER) != CMD_OK) return;

	refill_lamp(light, obj);

	player->upkeep->energy_use = z_info->move_energy / 2;
}